

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_benchmark_function.hpp
# Opt level: O0

void __thiscall
Catch::Benchmark::Detail::BenchmarkFunction::
model<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svens[P]xxx/xxx/invoke.bench.cpp:101:2)>
::call(model<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_svens[P]xxx_xxx_invoke_bench_cpp:101:2)>
       *this,Chronometer meter)

{
  model<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_svens[P]xxx_xxx_invoke_bench_cpp:101:2)>
  *this_local;
  Chronometer meter_local;
  
  call(this,meter.impl,meter.repeats);
  return;
}

Assistant:

void call(Chronometer meter) const override {
                        call(meter, is_callable<Fun(Chronometer)>());
                    }